

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O2

int nn_sinproc_recv(nn_pipebase *self,nn_msg *msg)

{
  byte *pbVar1;
  int *self_00;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  nn_fsm *self_01;
  undefined8 uVar4;
  
  self_01 = (nn_fsm *)&self[-1].data;
  if (self == (nn_pipebase *)0x0) {
    self_01 = (nn_fsm *)0x0;
  }
  if (*(int *)&self_01[1].fn - 6U < 0xfffffffe) {
    pcVar3 = 
    "sinproc->state == NN_SINPROC_STATE_ACTIVE || sinproc->state == NN_SINPROC_STATE_DISCONNECTED";
    uVar4 = 0xbb;
  }
  else {
    self_00 = &self_01[3].stopped.src;
    iVar2 = nn_msgqueue_recv((nn_msgqueue *)self_00,msg);
    __stream = _stderr;
    if (iVar2 != 0) {
      pcVar3 = nn_err_strerror(-iVar2);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
              ,0xbf);
      goto LAB_001207f9;
    }
    if ((*(int *)&self_01[1].fn == 5) || (((ulong)self_01[1].fn & 0x200000000) == 0)) {
LAB_0012076e:
      iVar2 = nn_msgqueue_empty((nn_msgqueue *)self_00);
      if (iVar2 == 0) {
        nn_pipebase_received((nn_pipebase *)&self_01[1].state);
      }
      return 0;
    }
    iVar2 = nn_msgqueue_send((nn_msgqueue *)self_00,(nn_msg *)(self_01[1].shutdown_fn + 0x180));
    if (iVar2 == -0xb) goto LAB_0012076e;
    if (iVar2 == 0) {
      nn_msg_init((nn_msg *)(self_01[1].shutdown_fn + 0x180),0);
      nn_fsm_raiseto(self_01,(nn_fsm *)self_01[1].shutdown_fn,
                     (nn_fsm_event *)&((nn_fsm *)self_01[1].shutdown_fn)[6].owner,0x6c41,5,self_01);
      pbVar1 = (byte *)((long)&self_01[1].fn + 4);
      *pbVar1 = *pbVar1 & 0xfd;
      goto LAB_0012076e;
    }
    pcVar3 = "rc == 0 || rc == -EAGAIN";
    uVar4 = 0xc6;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
          ,uVar4);
LAB_001207f9:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sinproc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  Sanity check. */
    nn_assert (sinproc->state == NN_SINPROC_STATE_ACTIVE ||
        sinproc->state == NN_SINPROC_STATE_DISCONNECTED);

    /*  Move the message to the caller. */
    rc = nn_msgqueue_recv (&sinproc->msgqueue, msg);
    errnum_assert (rc == 0, -rc);

    /*  If there was a message from peer lingering because of the exceeded
        buffer limit, try to enqueue it once again. */
    if (sinproc->state != NN_SINPROC_STATE_DISCONNECTED) {
        if (nn_slow (sinproc->flags & NN_SINPROC_FLAG_RECEIVING)) {
            rc = nn_msgqueue_send (&sinproc->msgqueue, &sinproc->peer->msg);
            nn_assert (rc == 0 || rc == -EAGAIN);
            if (rc == 0) {
                errnum_assert (rc == 0, -rc);
                nn_msg_init (&sinproc->peer->msg, 0);
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_received, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_RECEIVED, sinproc);
                sinproc->flags &= ~NN_SINPROC_FLAG_RECEIVING;
            }
        }
    }

    if (!nn_msgqueue_empty (&sinproc->msgqueue))
       nn_pipebase_received (&sinproc->pipebase);

    return 0;
}